

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::DragBehaviorT<long_long,long_long,double>
               (ImGuiDataType data_type,longlong *v,float v_speed,longlong v_min,longlong v_max,
               char *format,float power,ImGuiDragFlags flags)

{
  bool bVar1;
  ImGuiContext *pIVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  longlong lVar6;
  undefined1 *puVar7;
  ImGuiDataType data_type_00;
  uint uVar8;
  long lVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  float fVar13;
  double dVar14;
  float fVar15;
  float fVar16;
  double local_a0;
  ImVec2 local_50;
  undefined1 local_48 [16];
  
  pIVar2 = GImGui;
  uVar4 = data_type & 0xfffffffe;
  bVar10 = uVar4 != 8;
  bVar11 = v_max - v_min == 0;
  puVar7 = (undefined1 *)CONCAT71((int7)((ulong)v_max >> 8),bVar11);
  bVar12 = power == 1.0;
  if (v_speed == 0.0 && !bVar11) {
    v_speed = (float)(v_max - v_min) * GImGui->DragSpeedDefaultRatio;
  }
  uVar8 = flags & 1;
  if (GImGui->ActiveIdSource == ImGuiInputSource_Mouse) {
    bVar3 = IsMousePosValid((ImVec2 *)0x0);
    if ((!bVar3) || ((pIVar2->IO).MouseDragMaxDistanceSqr[0] <= 1.0)) goto LAB_0014b693;
    fVar16 = (pIVar2->IO).NavInputs[(ulong)uVar8 + 0x1e];
    if ((pIVar2->IO).KeyAlt != false) {
      fVar16 = fVar16 * 0.01;
    }
    if ((pIVar2->IO).KeyShift == true) {
      fVar16 = fVar16 * 10.0;
    }
  }
  else {
LAB_0014b693:
    fVar16 = 0.0;
    if (pIVar2->ActiveIdSource == ImGuiInputSource_Nav) {
      uVar5 = 0;
      if (uVar4 == 8) {
        uVar5 = ImParseFormatPrecision(format,3);
      }
      local_50 = GetNavInputAmount2d(3,ImGuiInputReadMode_RepeatFast,0.1,10.0);
      fVar16 = *(float *)(local_48 + (ulong)uVar8 * 4 + -8);
      if ((int)uVar5 < 0) {
        fVar15 = 1.1754944e-38;
      }
      else if ((int)uVar5 < 10) {
        puVar7 = GetMinimumStepAtDecimalPrecision(int)::min_steps;
        fVar15 = *(float *)(GetMinimumStepAtDecimalPrecision(int)::min_steps + (ulong)uVar5 * 4);
      }
      else {
        local_48 = ZEXT416((uint)fVar16);
        fVar15 = powf(10.0,(float)(int)-uVar5);
        fVar16 = (float)local_48._0_4_;
      }
      v_speed = (float)((uint)v_speed & -(uint)(fVar15 <= v_speed) |
                       ~-(uint)(fVar15 <= v_speed) & (uint)fVar15);
    }
  }
  fVar16 = fVar16 * v_speed;
  fVar15 = fVar16;
  if (uVar8 != 0) {
    fVar15 = -fVar16;
  }
  lVar9 = v_max - v_min;
  if (lVar9 == 0) {
    bVar3 = false;
  }
  else {
    puVar7 = (undefined1 *)*v;
    if (((long)puVar7 < v_max) || (bVar3 = true, fVar15 <= 0.0)) {
      bVar3 = (long)puVar7 <= v_min;
      puVar7 = (undefined1 *)CONCAT71((int7)((ulong)puVar7 >> 8),bVar3);
      bVar3 = fVar15 < 0.0 && bVar3;
    }
  }
  if ((bVar10 || bVar11) || bVar12) {
LAB_0014b7e4:
    bVar1 = false;
  }
  else if ((0.0 <= fVar15) || (bVar1 = true, pIVar2->DragCurrentAccum <= 0.0)) {
    if (fVar15 <= 0.0) goto LAB_0014b7e4;
    bVar1 = pIVar2->DragCurrentAccum <= 0.0 && pIVar2->DragCurrentAccum != 0.0;
  }
  lVar6 = CONCAT71((int7)((ulong)puVar7 >> 8),pIVar2->ActiveIdIsJustActivated | bVar3);
  if (((pIVar2->ActiveIdIsJustActivated & 1U) != 0 || bVar3 != false) || (bVar1)) {
    pIVar2->DragCurrentAccum = 0.0;
    bVar3 = false;
  }
  else {
    if ((fVar16 == 0.0) && (!NAN(fVar16))) goto LAB_0014b825;
    pIVar2->DragCurrentAccum = pIVar2->DragCurrentAccum + fVar15;
    bVar3 = true;
  }
  pIVar2->DragCurrentAccumDirty = bVar3;
LAB_0014b825:
  if (pIVar2->DragCurrentAccumDirty == true) {
    if ((bVar10 || bVar11) || bVar12) {
      data_type_00 = (int)*v + (int)(long)pIVar2->DragCurrentAccum;
      local_a0 = 0.0;
    }
    else {
      local_a0 = pow((double)(*v - v_min) / (double)lVar9,1.0 / (double)power);
      fVar13 = (float)((double)(pIVar2->DragCurrentAccum / (float)lVar9) + local_a0);
      fVar16 = 1.0;
      if (fVar13 <= 1.0) {
        fVar16 = fVar13;
      }
      fVar16 = powf((float)(~-(uint)(fVar13 < 0.0) & (uint)fVar16),power);
      data_type_00 = (int)(long)fVar16 * (int)lVar9 + (int)v_min;
    }
    lVar6 = RoundScalarWithFormatT<long_long,long_long>
                      ((ImGui *)format,(char *)(ulong)(uint)data_type,data_type_00,lVar6);
    pIVar2->DragCurrentAccumDirty = false;
    if ((bVar10 || bVar11) || bVar12) {
      fVar16 = (float)(lVar6 - *v);
    }
    else {
      dVar14 = pow((double)(lVar6 - v_min) / (double)lVar9,1.0 / (double)power);
      fVar16 = (float)(dVar14 - local_a0);
    }
    pIVar2->DragCurrentAccum = pIVar2->DragCurrentAccum - fVar16;
    lVar9 = *v;
    if ((v_max != v_min) && (lVar9 != lVar6)) {
      if ((lVar6 < v_min) || (((uVar4 != 8 && (lVar9 < lVar6)) && (fVar15 < 0.0)))) {
        lVar6 = v_min;
      }
      if ((v_max < lVar6) || (((uVar4 != 8 && (lVar6 < lVar9)) && (0.0 < fVar15)))) {
        lVar6 = v_max;
      }
    }
    bVar12 = lVar9 != lVar6;
    if (bVar12) {
      *v = lVar6;
      bVar12 = true;
    }
  }
  else {
    bVar12 = false;
  }
  return bVar12;
}

Assistant:

bool ImGui::DragBehaviorT(ImGuiDataType data_type, TYPE* v, float v_speed, const TYPE v_min, const TYPE v_max, const char* format, float power, ImGuiDragFlags flags)
{
    ImGuiContext& g = *GImGui;
    const ImGuiAxis axis = (flags & ImGuiDragFlags_Vertical) ? ImGuiAxis_Y : ImGuiAxis_X;
    const bool is_decimal = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);
    const bool has_min_max = (v_min != v_max);
    const bool is_power = (power != 1.0f && is_decimal && has_min_max && (v_max - v_min < FLT_MAX));

    // Default tweak speed
    if (v_speed == 0.0f && has_min_max && (v_max - v_min < FLT_MAX))
        v_speed = (float)((v_max - v_min) * g.DragSpeedDefaultRatio);

    // Inputs accumulates into g.DragCurrentAccum, which is flushed into the current value as soon as it makes a difference with our precision settings
    float adjust_delta = 0.0f;
    if (g.ActiveIdSource == ImGuiInputSource_Mouse && IsMousePosValid() && g.IO.MouseDragMaxDistanceSqr[0] > 1.0f*1.0f)
    {
        adjust_delta = g.IO.MouseDelta[axis];
        if (g.IO.KeyAlt)
            adjust_delta *= 1.0f / 100.0f;
        if (g.IO.KeyShift)
            adjust_delta *= 10.0f;
    }
    else if (g.ActiveIdSource == ImGuiInputSource_Nav)
    {
        int decimal_precision = is_decimal ? ImParseFormatPrecision(format, 3) : 0;
        adjust_delta = GetNavInputAmount2d(ImGuiNavDirSourceFlags_Keyboard | ImGuiNavDirSourceFlags_PadDPad, ImGuiInputReadMode_RepeatFast, 1.0f / 10.0f, 10.0f)[axis];
        v_speed = ImMax(v_speed, GetMinimumStepAtDecimalPrecision(decimal_precision));
    }
    adjust_delta *= v_speed;

    // For vertical drag we currently assume that Up=higher value (like we do with vertical sliders). This may become a parameter.
    if (axis == ImGuiAxis_Y)
        adjust_delta = -adjust_delta;

    // Clear current value on activation
    // Avoid altering values and clamping when we are _already_ past the limits and heading in the same direction, so e.g. if range is 0..255, current value is 300 and we are pushing to the right side, keep the 300.
    bool is_just_activated = g.ActiveIdIsJustActivated;
    bool is_already_past_limits_and_pushing_outward = has_min_max && ((*v >= v_max && adjust_delta > 0.0f) || (*v <= v_min && adjust_delta < 0.0f));
    bool is_drag_direction_change_with_power = is_power && ((adjust_delta < 0 && g.DragCurrentAccum > 0) || (adjust_delta > 0 && g.DragCurrentAccum < 0));
    if (is_just_activated || is_already_past_limits_and_pushing_outward || is_drag_direction_change_with_power)
    {
        g.DragCurrentAccum = 0.0f;
        g.DragCurrentAccumDirty = false;
    }
    else if (adjust_delta != 0.0f)
    {
        g.DragCurrentAccum += adjust_delta;
        g.DragCurrentAccumDirty = true;
    }

    if (!g.DragCurrentAccumDirty)
        return false;

    TYPE v_cur = *v;
    FLOATTYPE v_old_ref_for_accum_remainder = (FLOATTYPE)0.0f;

    if (is_power)
    {
        // Offset + round to user desired precision, with a curve on the v_min..v_max range to get more precision on one side of the range
        FLOATTYPE v_old_norm_curved = ImPow((FLOATTYPE)(v_cur - v_min) / (FLOATTYPE)(v_max - v_min), (FLOATTYPE)1.0f / power);
        FLOATTYPE v_new_norm_curved = v_old_norm_curved + (g.DragCurrentAccum / (v_max - v_min));
        v_cur = v_min + (TYPE)ImPow(ImSaturate((float)v_new_norm_curved), power) * (v_max - v_min);
        v_old_ref_for_accum_remainder = v_old_norm_curved;
    }
    else
    {
        v_cur += (TYPE)g.DragCurrentAccum;
    }

    // Round to user desired precision based on format string
    v_cur = RoundScalarWithFormatT<TYPE, SIGNEDTYPE>(format, data_type, v_cur);

    // Preserve remainder after rounding has been applied. This also allow slow tweaking of values.
    g.DragCurrentAccumDirty = false;
    if (is_power)
    {
        FLOATTYPE v_cur_norm_curved = ImPow((FLOATTYPE)(v_cur - v_min) / (FLOATTYPE)(v_max - v_min), (FLOATTYPE)1.0f / power);
        g.DragCurrentAccum -= (float)(v_cur_norm_curved - v_old_ref_for_accum_remainder);
    }
    else
    {
        g.DragCurrentAccum -= (float)((SIGNEDTYPE)v_cur - (SIGNEDTYPE)*v);
    }

    // Lose zero sign for float/double
    if (v_cur == (TYPE)-0)
        v_cur = (TYPE)0;

    // Clamp values (+ handle overflow/wrap-around for integer types)
    if (*v != v_cur && has_min_max)
    {
        if (v_cur < v_min || (v_cur > *v && adjust_delta < 0.0f && !is_decimal))
            v_cur = v_min;
        if (v_cur > v_max || (v_cur < *v && adjust_delta > 0.0f && !is_decimal))
            v_cur = v_max;
    }

    // Apply result
    if (*v == v_cur)
        return false;
    *v = v_cur;
    return true;
}